

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkDataTypes.cpp
# Opt level: O2

void __thiscall HighFreqDataType::print(HighFreqDataType *this)

{
  ostream *poVar1;
  
  std::operator<<((ostream *)&std::cout,"-Printing HighFreqDataType:\n");
  poVar1 = std::operator<<((ostream *)&std::cout,"  name: ");
  poVar1 = std::operator<<(poVar1,(string *)&this->name);
  poVar1 = std::operator<<(poVar1,"\n  origin: ");
  poVar1 = std::operator<<(poVar1,(string *)&this->origin);
  poVar1 = std::operator<<(poVar1,"\n  dataFormat: ");
  poVar1 = std::operator<<(poVar1,(string *)&this->dataFormat);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"  SockAddress: ");
  std::operator<<(poVar1,(string *)&this->sockAddr);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  return;
}

Assistant:

void HighFreqDataType::print() {
    std::cout << "-Printing HighFreqDataType:\n";
    std::cout << "  name: " << name << "\n  origin: " << origin << "\n  dataFormat: " << dataFormat << std::endl;
    std::cout << "  SockAddress: " << sockAddr;
    std::cout << std::endl;
}